

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

int __thiscall
FNodeBuilder::SelectSplitter
          (FNodeBuilder *this,DWORD set,node_t *node,DWORD *splitseg,int step,bool nosplit)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  FPrivSeg *pseg;
  uint local_48;
  
  uVar9 = (ulong)set;
  uVar11 = 0;
  memset((this->PlaneChecked).Array,0,(ulong)(this->PlaneChecked).Count);
  if (set == 0xffffffff) {
    local_48 = 0xffffffff;
  }
  else {
    local_48 = 0xffffffff;
    iVar12 = 0;
    iVar10 = 0;
    bVar6 = 0;
    bVar7 = 0;
    do {
      pseg = (this->Segs).Array + uVar9;
      iVar4 = iVar12 + -1;
      bVar2 = iVar12 < 2;
      iVar3 = iVar10;
      iVar12 = iVar4;
      uVar11 = local_48;
      if (bVar2) {
        uVar5 = 1 << ((byte)pseg->planenum & 7);
        uVar8 = pseg->planenum >> 3;
        if (((int)uVar8 < 0) || ((uVar5 & (this->PlaneChecked).Array[uVar8]) == 0)) {
          if (-1 < (int)uVar8) {
            pbVar1 = (this->PlaneChecked).Array + uVar8;
            *pbVar1 = *pbVar1 | (byte)uVar5;
          }
          SetNodeFromSeg(this,node,pseg);
          iVar4 = Heuristic(this,node,set,nosplit);
          iVar3 = iVar4;
          iVar12 = step;
          uVar11 = (uint)uVar9;
          if ((iVar4 <= iVar10) && (iVar3 = iVar10, bVar7 = bVar6, uVar11 = local_48, iVar4 < 0)) {
            bVar6 = 1;
            bVar7 = 1;
          }
        }
      }
      local_48 = uVar11;
      iVar10 = iVar3;
      uVar9 = (ulong)pseg->next;
    } while (pseg->next != 0xffffffff);
    uVar11 = (uint)bVar7;
  }
  if (local_48 == 0xffffffff) {
    iVar12 = -uVar11;
  }
  else {
    *splitseg = local_48;
    SetNodeFromSeg(this,node,(this->Segs).Array + local_48);
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

int FNodeBuilder::SelectSplitter (DWORD set, node_t &node, DWORD &splitseg, int step, bool nosplit)
{
	int stepleft;
	int bestvalue;
	DWORD bestseg;
	DWORD seg;
	bool nosplitters = false;

	bestvalue = 0;
	bestseg = DWORD_MAX;

	seg = set;
	stepleft = 0;

	memset (&PlaneChecked[0], 0, PlaneChecked.Size());

	D(Printf (PRINT_LOG, "Processing set %d\n", set));

	while (seg != DWORD_MAX)
	{
		FPrivSeg *pseg = &Segs[seg];

		if (--stepleft <= 0)
		{
			int l = pseg->planenum >> 3;
			int r = 1 << (pseg->planenum & 7);

			if (l < 0 || (PlaneChecked[l] & r) == 0)
			{
				if (l >= 0)
				{
					PlaneChecked[l] |= r;
				}

				stepleft = step;
				SetNodeFromSeg (node, pseg);

				int value = Heuristic (node, set, nosplit);

				D(Printf (PRINT_LOG, "Seg %5d, ld %d (%5d,%5d)-(%5d,%5d) scores %d\n", seg, Segs[seg].linedef, node.x>>16, node.y>>16,
					(node.x+node.dx)>>16, (node.y+node.dy)>>16, value));

				if (value > bestvalue)
				{
					bestvalue = value;
					bestseg = seg;
				}
				else if (value < 0)
				{
					nosplitters = true;
				}
			}
		}

		seg = pseg->next;
	}

	if (bestseg == DWORD_MAX)
	{ // No lines split any others into two sets, so this is a convex region.
	D(Printf (PRINT_LOG, "set %d, step %d, nosplit %d has no good splitter (%d)\n", set, step, nosplit, nosplitters));
		return nosplitters ? -1 : 0;
	}

	D(Printf (PRINT_LOG, "split seg %u in set %d, score %d, step %d, nosplit %d\n", bestseg, set, bestvalue, step, nosplit));

	splitseg = bestseg;
	SetNodeFromSeg (node, &Segs[bestseg]);
	return 1;
}